

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libasd_py.cpp
# Opt level: O0

void add_read_asd(module *mod)

{
  module *this;
  arg local_40;
  type local_29;
  arg local_28;
  type local_11;
  module *local_10;
  module *mod_local;
  
  local_10 = mod;
  pybind11::arg::arg(&local_28,"file_name");
  pybind11::module_::def<add_read_asd(pybind11::module_&)::__0,pybind11::arg,char[81]>
            (mod,"read_raw_data",&local_11,&local_28,
             (char (*) [81])
             "This function reads `.asd` file without converting signal to height information.");
  this = local_10;
  pybind11::arg::arg(&local_40,"file_name");
  pybind11::module_::def<add_read_asd(pybind11::module_&)::__1,pybind11::arg,char[79]>
            (this,"read_asd",&local_29,&local_40,
             (char (*) [79])
             "This function reads `.asd` file after converting signal to height information.");
  return;
}

Assistant:

void add_read_asd(py::module& mod) // {{{
{
    mod.def("read_raw_data",
        [](const std::string& fname) -> py::object {
            std::ifstream ifs(fname);
            if(!ifs.good())
            {
                throw std::runtime_error("file open error: " + fname);
            }

            const auto v = asd::read_version(ifs);
            switch(v)
            {
                case 0:
                {
                    if(asd::read_header<asd::version<0>>(ifs).data_type_2ch ==
                            asd::data_kind::none)
                    {
                        ifs.seekg(0, std::ios_base::beg);
                        return py::cast(asd::read_raw_data<
                            asd::ch<1>, asd::ver<0>, asd::container::vec>(ifs));
                    }
                    else
                    {
                        ifs.seekg(0, std::ios_base::beg);
                        return py::cast(asd::read_raw_data<
                            asd::ch<2>, asd::ver<0>, asd::container::vec>(ifs));
                    }
                }
                case 1:
                {
                    if(asd::read_header<asd::version<1>>(ifs).data_kind_2ch ==
                            asd::data_kind::none)
                    {
                        ifs.seekg(0, std::ios_base::beg);
                        return py::cast(asd::read_raw_data<
                            asd::ch<1>, asd::ver<1>, asd::container::vec>(ifs));
                    }
                    else
                    {
                        ifs.seekg(0, std::ios_base::beg);
                        return py::cast(asd::read_raw_data<
                            asd::ch<2>, asd::ver<1>, asd::container::vec>(ifs));
                    }
                }
                case 2:
                {
                    if(asd::read_header<asd::version<2>>(ifs).data_kind_2ch ==
                            asd::data_kind::none)
                    {
                        ifs.seekg(0, std::ios_base::beg);
                        return py::cast(asd::read_raw_data<
                            asd::ch<1>, asd::ver<2>, asd::container::vec>(ifs));
                    }
                    else
                    {
                        ifs.seekg(0, std::ios_base::beg);
                        return py::cast(asd::read_raw_data<
                            asd::ch<2>, asd::ver<2>, asd::container::vec>(ifs));
                    }
                }
                default: throw std::invalid_argument(
                             "invalid asd version: " + std::to_string(v));
            }
        },
        py::arg("file_name"),
        "This function reads `.asd` file without converting signal "
        "to height information."
        );

    mod.def("read_asd",
        [](const std::string& fname) -> py::object {
            std::ifstream ifs(fname);
            if(!ifs.good())
            {
                throw std::runtime_error("file open error: " + fname);
            }

            const auto v = asd::read_version(ifs);
            switch(v)
            {
                case 0:
                {
                    if(asd::read_header<asd::version<0>>(ifs).data_type_2ch ==
                            asd::data_kind::none)
                    {
                        ifs.seekg(0, std::ios_base::beg);
                        return py::cast(asd::read_asd<double,
                            asd::ch<1>, asd::ver<0>, asd::container::vec>(ifs));
                    }
                    else
                    {
                        ifs.seekg(0, std::ios_base::beg);
                        return py::cast(asd::read_asd<double,
                            asd::ch<2>, asd::ver<0>, asd::container::vec>(ifs));
                    }
                }
                case 1:
                {
                    if(asd::read_header<asd::version<1>>(ifs).data_kind_2ch ==
                            asd::data_kind::none)
                    {
                        ifs.seekg(0, std::ios_base::beg);
                        return py::cast(asd::read_asd<double,
                            asd::ch<1>, asd::ver<1>, asd::container::vec>(ifs));
                    }
                    else
                    {
                        ifs.seekg(0, std::ios_base::beg);
                        return py::cast(asd::read_asd<double,
                            asd::ch<2>, asd::ver<1>, asd::container::vec>(ifs));
                    }
                }
                case 2:
                {
                    if(asd::read_header<asd::version<2>>(ifs).data_kind_2ch ==
                            asd::data_kind::none)
                    {
                        ifs.seekg(0, std::ios_base::beg);
                        return py::cast(asd::read_asd<double,
                            asd::ch<1>, asd::ver<2>, asd::container::vec>(ifs));
                    }
                    else
                    {
                        ifs.seekg(0, std::ios_base::beg);
                        return py::cast(asd::read_asd<double,
                            asd::ch<2>, asd::ver<2>, asd::container::vec>(ifs));
                    }
                }
                default: throw std::invalid_argument(
                             "invalid asd version: " + std::to_string(v));
            }
        },
        py::arg("file_name"),
        "This function reads `.asd` file after converting signal "
        "to height information."
        );

    return;
}